

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::check_basename_match_word_prefix
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  *this_00;
  char32_t *pcVar1;
  pointer p_Var2;
  pointer pCVar3;
  value_type vVar4;
  long lVar5;
  value_type vVar6;
  bool bVar7;
  bool prev_alphanumeric;
  bool prev_uppercase;
  Iterator query_it;
  const_iterator query_last;
  const_iterator item_last;
  Iterator item_it;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  props_it;
  anon_class_56_7_13232ace consume_word_prefix;
  bool local_8a;
  bool local_89;
  value_type local_88;
  const_iterator local_80;
  const_iterator local_78;
  Iterator local_70;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  local_68;
  anon_class_56_7_13232ace local_60;
  
  this_00 = &this->qit_basename_words_;
  p_Var2 = (this->qit_basename_words_).
           super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->qit_basename_words_).
      super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != p_Var2) {
    (this->qit_basename_words_).
    super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = p_Var2;
  }
  std::
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ::push_back(this_00,&this->qit_basename_);
  local_70._M_current = (this->item_basename_)._M_current;
  local_78._M_current =
       (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (local_78._M_current != local_70._M_current) {
    local_88._M_current = (this->qit_basename_)._M_current;
    local_80._M_current =
         (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (local_80._M_current != local_88._M_current) {
      pCVar3 = (this->props_).
               super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)local_70._M_current -
              (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      local_68._M_current = pCVar3 + lVar5;
      local_60.props_it = &local_68;
      local_89 = pCVar3[lVar5].uppercase;
      local_60.prev_uppercase = &local_89;
      local_8a = pCVar3[lVar5].alphanumeric;
      local_60.prev_alphanumeric = &local_8a;
      pCVar3[lVar5].word_start = true;
      local_60.item_it = &local_70;
      local_60.query_last = &local_80;
      local_60.item_last = &local_78;
      local_60.query_it = &local_88;
      do {
        check_basename_match_word_prefix::anon_class_56_7_13232ace::operator()(&local_60);
        bVar7 = local_88._M_current == local_80._M_current;
        if (bVar7) {
          this->prefix_level_ = BASENAME_WORD;
          std::
          vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
          ::push_back(this_00,&local_88);
          return bVar7;
        }
        if (local_70._M_current == local_78._M_current) {
          this->basename_longest_submatch_ = 0;
          this->basename_word_gaps_ = 0;
          return bVar7;
        }
        vVar4._M_current = local_88._M_current;
        if (*local_70._M_current != *local_88._M_current) {
          vVar6._M_current = local_88._M_current;
          do {
            vVar4._M_current = local_88._M_current;
            if (vVar6._M_current <=
                (this->qit_basename_words_).
                super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current + 1) break;
            vVar4._M_current = vVar6._M_current + -1;
            pcVar1 = vVar6._M_current + -1;
            vVar6._M_current = vVar4._M_current;
          } while (*local_70._M_current != *pcVar1);
        }
        local_88._M_current = vVar4._M_current;
        std::
        vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
        ::push_back(this_00,&local_88);
      } while( true );
    }
  }
  return false;
}

Assistant:

bool check_basename_match_word_prefix() {
    qit_basename_words_.clear();
    qit_basename_words_.push_back(qit_basename_);

    auto item_it = item_basename_;
    auto const item_last = item_.cend();
    if (item_it == item_last) {
      return false;
    }
    auto query_it = qit_basename_;
    auto const query_last = query_.cend();
    if (query_it == query_last) {
      return false;
    }
    auto props_it = props_.begin() + (item_basename_ - item_.cbegin());

    bool prev_uppercase = props_it->uppercase;
    bool prev_alphanumeric = props_it->alphanumeric;
    props_it->word_start = true;

    // Advances `item_it` and `props_it` to the beginning of the next word. For
    // each consecutive iterated character in the item matched by a character
    // in the query before `query_last`, advances `query_it`.
    //
    // Precondition: `item_it != item_last`; `query_it != query_last`.
    // Postcondition: `item_it` is always advanced by at least 1.
    auto const consume_word_prefix = [&] {
      bool can_match = true;
      while (true) {
        // Require that all alphanumeric matches in this word be contiguous.
        if (can_match || !prev_alphanumeric) {
          if (*item_it == *query_it) {
            ++query_it;
            if (query_it == query_last) {
              break;
            }
          } else {
            can_match = false;
          }
        }
        ++item_it;
        if (item_it == item_last) {
          break;
        }
        ++props_it;
        bool const uppercase = props_it->uppercase;
        bool const alphanumeric = props_it->alphanumeric;
        bool const word_start = (!prev_uppercase && uppercase) ||
                                (!prev_alphanumeric && alphanumeric);
        props_it->word_start = word_start;
        prev_uppercase = uppercase;
        prev_alphanumeric = alphanumeric;
        if (word_start) {
          break;
        }
      }
    };

    consume_word_prefix();
    while (query_it != query_last) {
      if (item_it == item_last) {
        basename_longest_submatch_ = 0;
        basename_word_gaps_ = 0;
        return false;
      }
      // If the next unmatched query character doesn't match the first
      // character of the next word, allow partial backtracking (all but the
      // first character) of the match in the previous word in order to find a
      // match for this one.
      auto const c = *item_it;
      if (c != *query_it) {
        for (auto steal_rit = ReverseIterator(query_it),
                  steal_rlast = ReverseIterator(qit_basename_words_.back() + 1);
             steal_rit < steal_rlast; ++steal_rit) {
          if (c == *steal_rit) {
            query_it = (steal_rit + 1).base();
            break;
          }
        }
      }
      qit_basename_words_.push_back(query_it);
      consume_word_prefix();
    }
    prefix_level_ = PrefixLevel::BASENAME_WORD;
    // Push `query_it` onto `qit_basename_words_` even though we know it's
    // `query_.cend()` to avoid special-casing the end case in
    // `score_basename_word_prefix_match`.
    qit_basename_words_.push_back(query_it);
    return true;
  }